

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall UnitTests::Assert::Fail(Assert *this)

{
  allocator local_31;
  string local_30 [32];
  Assert *local_10;
  Assert *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Test FAIL\'ed",&local_31);
  Fail(this,(string *)local_30);
}

Assistant:

[[noreturn]] void Fail() const { Fail("Test FAIL'ed"); }